

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O0

string * webfront::uri::encode_abi_cxx11_(string_view uri)

{
  char cVar1;
  int iVar2;
  const_iterator pvVar3;
  string *in_RDI;
  value_type_conflict c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  string *encoded;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffb0);
  local_30 = http::std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_18);
  pvVar3 = http::std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
  for (; local_30 != pvVar3; local_30 = local_30 + 1) {
    cVar1 = *local_30;
    iVar2 = isalnum((int)cVar1);
    if ((((iVar2 == 0) && (cVar1 != '-')) && (cVar1 != '_')) && ((cVar1 != '.' && (cVar1 != '~'))))
    {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,(char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      std::array<char,_16UL>::operator[]
                ((array<char,_16UL> *)this,
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 in_stack_ffffffffffffff9f);
      std::array<char,_16UL>::operator[]
                ((array<char,_16UL> *)this,
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 in_stack_ffffffffffffff9f);
    }
    else {
      http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 in_stack_ffffffffffffff9f);
    }
  }
  return in_RDI;
}

Assistant:

[[nodiscard]] inline std::string encode(std::string_view uri) {
    std::string encoded;
    static std::array digits{'0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F'};
    for (auto c : uri) {
        if (std::isalnum(c) || c == '-' || c == '_' || c == '.' || c == '~')
            encoded += c;
        else {
            encoded += "%";
            encoded += digits[static_cast<size_t>(c >> 4)];
            encoded += digits[static_cast<size_t>(c % 16)];
        }
    }
    return encoded;
}